

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O2

int LoadEXRImageFromMemory(EXRImage *exr_image,EXRHeader *exr_header,uchar *memory,char **err)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  char *pcVar6;
  size_type sVar7;
  ulong uVar8;
  size_type __n;
  ulong uStack_60;
  allocator_type local_49;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> offsets;
  
  if (exr_image == (EXRImage *)0x0 || memory == (uchar *)0x0) {
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar6 = "Invalid argument.";
  }
  else {
    uVar1 = exr_header->header_len;
    if ((ulong)uVar1 != 0) {
      iVar2 = exr_header->compression_type;
      uStack_60 = 0x10;
      if ((iVar2 != 3) && (iVar2 != 0x80)) {
        if (iVar2 == 4) {
          uStack_60 = 0x20;
        }
        else {
          uStack_60 = 1;
        }
      }
      __n = (size_type)exr_header->chunk_count;
      if ((long)__n < 1) {
        uVar5 = ((long)exr_header->data_window[3] - (long)exr_header->data_window[1]) + 1;
        if (exr_header->tiled == 0) {
          uVar3 = (ulong)(long)(int)uVar5 / uStack_60;
          __n = uVar3 + (uStack_60 * uVar3 < (ulong)(long)(int)uVar5);
        }
        else {
          uVar8 = (ulong)((exr_header->data_window[2] - exr_header->data_window[0]) + 1);
          uVar3 = uVar8 / (ulong)(long)exr_header->tile_size_x;
          uVar4 = uVar5 / (ulong)(long)exr_header->tile_size_y;
          __n = (uVar4 + ((long)exr_header->tile_size_y * uVar4 < uVar5)) *
                (uVar3 + ((long)exr_header->tile_size_x * uVar3 < uVar8));
        }
      }
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
                (&offsets,__n,&local_49);
      for (sVar7 = 0; __n != sVar7; sVar7 = sVar7 + 1) {
        offsets.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
        super__Vector_impl_data._M_start[sVar7] =
             *(unsigned_long_long *)(memory + sVar7 * 8 + (ulong)uVar1 + 8);
      }
      tinyexr::DecodeChunk(exr_image,exr_header,&offsets,memory);
      std::_Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~_Vector_base
                (&offsets.
                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>);
      return 0;
    }
    if (err == (char **)0x0) {
      return -3;
    }
    pcVar6 = "EXRHeader is not initialized.";
  }
  *err = pcVar6;
  return -3;
}

Assistant:

int LoadEXRImageFromMemory(EXRImage *exr_image, const EXRHeader *exr_header,
                           const unsigned char *memory, const char **err) {
  if (exr_image == NULL || memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  if (exr_header->header_len == 0) {
    if (err) {
      (*err) = "EXRHeader is not initialized.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  const unsigned char *head = memory;
  const unsigned char *marker = reinterpret_cast<const unsigned char *>(
      memory + exr_header->header_len +
      8);  // +8 for magic number + version header.
  return tinyexr::DecodeEXRImage(exr_image, exr_header, head, marker, err);
}